

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O0

void DownHeap(INT32 Index)

{
  short sVar1;
  int local_10;
  INT32 Index3;
  INT32 Index2;
  INT32 Index_local;
  
  sVar1 = mHeap[Index];
  Index3 = Index;
  for (local_10 = Index << 1; local_10 <= mHeapSize; local_10 = local_10 << 1) {
    if ((local_10 < mHeapSize) && (mFreq[mHeap[local_10 + 1]] < mFreq[mHeap[local_10]])) {
      local_10 = local_10 + 1;
    }
    if (mFreq[(int)sVar1] <= mFreq[mHeap[local_10]]) break;
    mHeap[Index3] = mHeap[local_10];
    Index3 = local_10;
  }
  mHeap[Index3] = sVar1;
  return;
}

Assistant:

STATIC 
VOID 
DownHeap (
  IN INT32 i
  )
{
  INT32 j, k;

  //
  // priority queue: send i-th entry down heap
  //
  
  k = mHeap[i];
  while ((j = 2 * i) <= mHeapSize) {
    if (j < mHeapSize && mFreq[mHeap[j]] > mFreq[mHeap[j + 1]]) {
      j++;
    }
    if (mFreq[k] <= mFreq[mHeap[j]]) {
      break;
    }
    mHeap[i] = mHeap[j];
    i = j;
  }
  mHeap[i] = (INT16)k;
}